

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

int wally_varbuff_get_length(uchar *bytes,size_t bytes_len,size_t *written)

{
  long lStack_8;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((bytes_len == 0) != (bytes != (uchar *)0x0) && written != (size_t *)0x0) {
    if (bytes_len < 0xfd) {
      lStack_8 = 1;
    }
    else if (bytes_len < 0x10000) {
      lStack_8 = 3;
    }
    else {
      lStack_8 = (ulong)(bytes_len >> 0x20 != 0) * 4 + 5;
    }
    *written = lStack_8 + bytes_len;
    return 0;
  }
  return -2;
}

Assistant:

int wally_varbuff_get_length(const unsigned char *bytes, size_t bytes_len, size_t *written)
{
    if (written)
        *written = 0;
    if (BYTES_INVALID(bytes, bytes_len) || !written)
        return WALLY_EINVAL;
    *written = varint_get_length(bytes_len) + bytes_len;
    return WALLY_OK;
}